

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::Config::streamData(Config *this,string *parameter)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  stream_data_set = true;
  bVar1 = std::operator==(parameter,"compress");
  if (bVar1) {
    ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    stream_data_mode = qpdf_s_compress;
  }
  else {
    bVar1 = std::operator==(parameter,"preserve");
    if (bVar1) {
      ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      stream_data_mode = qpdf_s_preserve;
    }
    else {
      bVar1 = std::operator==(parameter,"uncompress");
      if (bVar1) {
        ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        stream_data_mode = qpdf_s_uncompress;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_30,"invalid stream-data option",&local_31);
        usage(&local_30);
        std::__cxx11::string::~string((string *)&local_30);
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::streamData(std::string const& parameter)
{
    o.m->stream_data_set = true;
    if (parameter == "compress") {
        o.m->stream_data_mode = qpdf_s_compress;
    } else if (parameter == "preserve") {
        o.m->stream_data_mode = qpdf_s_preserve;
    } else if (parameter == "uncompress") {
        o.m->stream_data_mode = qpdf_s_uncompress;
    } else {
        usage("invalid stream-data option");
    }
    return this;
}